

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryWaitableObject::Initialize
          (CSharedMemoryWaitableObject *this,CPalThread *pthr,CObjectAttributes *poa)

{
  SynchronizationSupport SVar1;
  LPVOID pvVar2;
  SHMObjData *pshmod;
  PAL_ERROR palError;
  CObjectAttributes *poa_local;
  CPalThread *pthr_local;
  CSharedMemoryWaitableObject *this_local;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x471);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x472);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  pshmod._4_4_ = CSharedMemoryObject::Initialize(&this->super_CSharedMemoryObject,pthr,poa);
  if (pshmod._4_4_ == 0) {
    SVar1 = CObjectType::GetSynchronizationSupport
                      ((this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot);
    if (SVar1 != WaitableObject) {
      fprintf(_stderr,"] %s %s:%d","Initialize",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x485);
      fprintf(_stderr,
              "Expression: CObjectType::WaitableObject == m_pot->GetSynchronizationSupport()\n");
    }
    pshmod._4_4_ = (**(code **)(*g_pSynchronizationManager + 0x38))
                             (g_pSynchronizationManager,
                              (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot,
                              (this->super_CSharedMemoryObject).m_ObjectDomain,&this->m_pvSynchData)
    ;
    if ((pshmod._4_4_ == 0) && ((this->super_CSharedMemoryObject).m_ObjectDomain == SharedObject)) {
      pvVar2 = SHMPtrToPtr((this->super_CSharedMemoryObject).m_shmod);
      if (pvVar2 == (LPVOID)0x0) {
        fprintf(_stderr,"] %s %s:%d","Initialize",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0x490);
        fprintf(_stderr,"Expression: NULL != pshmod\n");
      }
      *(VOID **)((long)pvVar2 + 0x40) = this->m_pvSynchData;
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pshmod._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryWaitableObject::Initialize(
    CPalThread *pthr,
    CObjectAttributes *poa
    )
{
    PAL_ERROR palError = NO_ERROR;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != poa);

    ENTRY("CSharedMemoryWaitableObject::Initialize"
        "(this = %p, pthr = %p, poa = %p)\n",
        this,
        pthr,
        poa
        );

    palError = CSharedMemoryObject::Initialize(pthr, poa);
    if (NO_ERROR != palError)
    {
        goto InitializeExit;
    }

    //
    // Sanity check the passed in object type
    //

    _ASSERTE(CObjectType::WaitableObject == m_pot->GetSynchronizationSupport());

    palError = g_pSynchronizationManager->AllocateObjectSynchData(
        m_pot,
        m_ObjectDomain,
        &m_pvSynchData
        );

    if (NO_ERROR == palError && SharedObject == m_ObjectDomain)
    {        
        SHMObjData *pshmod = SHMPTR_TO_TYPED_PTR(SHMObjData, m_shmod);
        _ASSERTE(NULL != pshmod);

        pshmod->pvSynchData = m_pvSynchData;
    }

InitializeExit:

    LOGEXIT("CSharedMemoryWaitableObject::Initialize returns %d\n", palError);

    return palError;
}